

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O0

float __thiscall Sequence<DNA>::NumExpectedErrors(Sequence<DNA> *this)

{
  bool bVar1;
  ulong uVar2;
  reference pcVar3;
  QScore *this_00;
  double dVar4;
  char *q;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  float numExpectedErrors;
  Sequence<DNA> *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __range1._4_4_ = 0.0;
    __end1._M_current = (char *)std::__cxx11::string::begin();
    q = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&q);
      if (!bVar1) break;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      this_00 = FASTQ::QScore::Instance();
      dVar4 = FASTQ::QScore::AsciiToProbability(this_00,*pcVar3);
      __range1._4_4_ = (float)((double)__range1._4_4_ + dVar4);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    this_local._4_4_ = __range1._4_4_;
  }
  else {
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float Sequence< A >::NumExpectedErrors() const {
  if( quality.empty() )
    return 0.0f;

  float numExpectedErrors = 0.0f;
  for( auto &q : quality ) {
    numExpectedErrors += FASTQ::QScore::Instance().AsciiToProbability( q );
  }
  return numExpectedErrors;
}